

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_load.cpp
# Opt level: O2

void __thiscall FScriptLoader::ParseInfoCmd(FScriptLoader *this,char *line,FString *scriptsrc)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  FString *pFVar6;
  char *pcVar7;
  FScanner sc;
  
  for (pcVar4 = line; *pcVar4 != '\0'; pcVar4 = pcVar4 + 1) {
    if (*pcVar4 < ' ') {
      *pcVar4 = ' ';
    }
  }
  if (this->readtype == RT_SCRIPT) {
    cVar1 = *line;
LAB_005eb083:
    if (cVar1 == '[') {
      iVar3 = strncasecmp(line + 1,"scripts",7);
      if (iVar3 == 0) {
        this->readtype = RT_SCRIPT;
        this->HasScripts = true;
        return;
      }
      iVar3 = strncasecmp(line + 1,"level info",10);
      if (iVar3 != 0) {
        return;
      }
      this->readtype = RT_INFO;
      return;
    }
  }
  else {
    sVar5 = strlen(line);
    pcVar4 = line + sVar5;
    while (pcVar4 = pcVar4 + -1, *pcVar4 == ' ') {
      *pcVar4 = '\0';
    }
    for (; cVar1 = *line, cVar1 == ' '; line = line + 1) {
    }
    if (cVar1 == '\0') {
      return;
    }
    if (cVar1 == '#') {
      return;
    }
    if (cVar1 != '/') {
      if (cVar1 == ';') {
        return;
      }
      goto LAB_005eb083;
    }
    if (line[1] == '/') {
      return;
    }
  }
  if (this->readtype != RT_INFO) {
    if (this->readtype != RT_SCRIPT) {
      return;
    }
    pFVar6 = FString::operator+=(scriptsrc,line);
    FString::operator+=(pFVar6,'\n');
    return;
  }
  FScanner::FScanner(&sc);
  sVar5 = strlen(line);
  FScanner::OpenMem(&sc,"LEVELINFO",line,(int)sVar5);
  FScanner::SetCMode(&sc,true);
  FScanner::MustGetString(&sc);
  bVar2 = FScanner::Compare(&sc,"levelname");
  if (bVar2) {
    pcVar4 = strchr(line,0x3d);
    do {
      pcVar7 = pcVar4 + 1;
      pcVar4 = pcVar4 + 1;
    } while (*pcVar7 < '!');
    pcVar7 = strstr(pcVar4,"//");
    if (pcVar7 != (char *)0x0) {
      *pcVar7 = '\0';
    }
    FString::operator=(&level.LevelName,pcVar4);
  }
  else {
    bVar2 = FScanner::Compare(&sc,"partime");
    if (bVar2) {
      FScanner::MustGetStringName(&sc,"=");
      FScanner::MustGetNumber(&sc);
      level.partime = sc.Number;
    }
    else {
      bVar2 = FScanner::Compare(&sc,"music");
      if (bVar2) {
        FScanner::MustGetStringName(&sc,"=");
        FScanner::MustGetString(&sc);
        bVar2 = FS_ChangeMusic(sc.String);
        if (!bVar2) {
          S_ChangeMusic(level.Music.Chars,level.musicorder,true,false);
        }
      }
      else {
        bVar2 = FScanner::Compare(&sc,"skyname");
        if (bVar2) {
          FScanner::MustGetStringName(&sc,"=");
          FScanner::MustGetString(&sc);
          sky1texture = FTextureManager::GetTexture(&TexMan,sc.String,1,6);
          sky2texture.texnum = sky1texture.texnum;
          level.skytexture1 = sky1texture;
          level.skytexture2 = sky1texture;
          R_InitSkyMap();
        }
        else {
          bVar2 = FScanner::Compare(&sc,"interpic");
          if (bVar2) {
            FScanner::MustGetStringName(&sc,"=");
            FScanner::MustGetString(&sc);
            pFVar6 = &(level.info)->ExitPic;
          }
          else {
            bVar2 = FScanner::Compare(&sc,"gravity");
            if (bVar2) {
              FScanner::MustGetStringName(&sc,"=");
              FScanner::MustGetNumber(&sc);
              level.gravity = (double)((float)sc.Number * 8.0);
              goto LAB_005eb1d7;
            }
            bVar2 = FScanner::Compare(&sc,"nextlevel");
            if (bVar2) {
              FScanner::MustGetStringName(&sc,"=");
              FScanner::MustGetString(&sc);
              pFVar6 = &level.NextMap;
            }
            else {
              bVar2 = FScanner::Compare(&sc,"nextsecret");
              if (!bVar2) {
                bVar2 = FScanner::Compare(&sc,"drown");
                if (bVar2) {
                  FScanner::MustGetStringName(&sc,"=");
                  FScanner::MustGetNumber(&sc);
                  this->drownflag = (uint)(sc.Number != 0);
                }
                else {
                  bVar2 = FScanner::Compare(&sc,"consolecmd");
                  if (bVar2) {
                    pcVar4 = strchr(line,0x3d);
                    do {
                      pcVar7 = pcVar4 + 1;
                      pcVar4 = pcVar4 + 1;
                    } while (*pcVar7 < ' ');
                    pcVar7 = strstr(pcVar4,"//");
                    if (pcVar7 != (char *)0x0) {
                      *pcVar7 = '\0';
                    }
                    FS_EmulateCmd(pcVar4);
                  }
                  else {
                    bVar2 = FScanner::Compare(&sc,"ignore");
                    if (bVar2) {
                      FScanner::MustGetStringName(&sc,"=");
                      FScanner::MustGetNumber(&sc);
                      this->IgnoreInfo = sc.Number != 0;
                    }
                  }
                }
                goto LAB_005eb1d7;
              }
              FScanner::MustGetStringName(&sc,"=");
              FScanner::MustGetString(&sc);
              pFVar6 = &level.NextSecretMap;
            }
          }
          FString::operator=(pFVar6,sc.String);
        }
      }
    }
  }
LAB_005eb1d7:
  FScanner::Close(&sc);
  FScanner::~FScanner(&sc);
  return;
}

Assistant:

void FScriptLoader::ParseInfoCmd(char *line, FString &scriptsrc)
{
	char *temp;
	
	// clear any control chars
	for(temp=line; *temp; temp++) if (*temp<32) *temp=32;

	if(readtype != RT_SCRIPT)       // not for scripts
	{
		temp = line+strlen(line)-1;

		// strip spaces at the beginning and end of the line
		while(*temp == ' ')	*temp-- = 0;
		while(*line == ' ') line++;
		
		if(!*line) return;
		
		if((line[0] == '/' && line[1] == '/') ||     // comment
			line[0] == '#' || line[0] == ';') return;
	}
	
	if(*line == '[')                // a new section seperator
	{
		line++;
		
		if(!strnicmp(line, "scripts", 7))
		{
			readtype = RT_SCRIPT;
			HasScripts = true;    // has scripts
		}
		else if (!strnicmp(line, "level info", 10))
		{
			readtype = RT_INFO;
		}
		return;
	}
	
	if (readtype==RT_SCRIPT)
	{
		scriptsrc << line << '\n';
	}
	else if (readtype==RT_INFO)
	{
		// Read the usable parts of the level info header 
		// and ignore the rest.
		FScanner sc;
		sc.OpenMem("LEVELINFO", line, (int)strlen(line));
		sc.SetCMode(true);
		sc.MustGetString();
		if (sc.Compare("levelname"))
		{
			char * beg = strchr(line, '=')+1;
			while (*beg<=' ') beg++;
			char * comm = strstr(beg, "//");
			if (comm) *comm=0;
			level.LevelName = beg;
		}
		else if (sc.Compare("partime"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			level.partime=sc.Number;
		}
		else if (sc.Compare("music"))
		{
			bool FS_ChangeMusic(const char * string);

			sc.MustGetStringName("=");
			sc.MustGetString();
			if (!FS_ChangeMusic(sc.String))
			{
				S_ChangeMusic(level.Music, level.musicorder);
			}
		}
		else if (sc.Compare("skyname"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
		
			sky2texture = sky1texture = level.skytexture1 = level.skytexture2 = TexMan.GetTexture (sc.String, FTexture::TEX_Wall, FTextureManager::TEXMAN_Overridable|FTextureManager::TEXMAN_ReturnFirst);
			R_InitSkyMap ();
		}
		else if (sc.Compare("interpic"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			level.info->ExitPic = sc.String;
		}
		else if (sc.Compare("gravity"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			level.gravity=sc.Number*8.f;
		}
		else if (sc.Compare("nextlevel"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			level.NextMap = sc.String;
		}
		else if (sc.Compare("nextsecret"))
		{
			sc.MustGetStringName("=");
			sc.MustGetString();
			level.NextSecretMap = sc.String;
		}
		else if (sc.Compare("drown"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			drownflag=!!sc.Number;
		}
		else if (sc.Compare("consolecmd"))
		{
			char * beg = strchr(line, '=')+1;
			while (*beg<' ') beg++;
			char * comm = strstr(beg, "//");
			if (comm) *comm=0;
			FS_EmulateCmd(beg);
		}
		else if (sc.Compare("ignore"))
		{
			sc.MustGetStringName("=");
			sc.MustGetNumber();
			IgnoreInfo=!!sc.Number;
		}
		// Ignore anything unknows
		sc.Close();
	}
}